

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ReadPrimes(char *pFileName)

{
  undefined4 uVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  ulong uVar8;
  undefined4 *puVar9;
  int Nums [10000];
  undefined4 local_9c68 [10000];
  
  puVar7 = local_9c68;
  puVar9 = local_9c68;
  __stream = fopen(pFileName,"rb");
  uVar4 = 0xffffffffffffffff;
  do {
    uVar3 = uVar4;
    iVar2 = __isoc99_fscanf(__stream,"%d",puVar7);
    uVar4 = uVar3 + 1;
    puVar7 = (undefined4 *)((long)puVar7 + 4);
  } while (iVar2 == 1);
  fclose(__stream);
  if (0x3fe < uVar4) {
    srand(0x6f);
    uVar8 = 0xffffffffffffffff;
    do {
      iVar2 = rand();
      iVar2 = iVar2 % ((int)uVar3 + 2);
      uVar1 = local_9c68[uVar8 + 1];
      local_9c68[uVar8 + 1] = local_9c68[iVar2];
      local_9c68[iVar2] = uVar1;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
    lVar5 = 0;
    do {
      printf("    ");
      lVar6 = 0;
      do {
        printf("%d,",(ulong)*(uint *)((long)puVar9 + lVar6 * 4));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      putchar(10);
      lVar5 = lVar5 + 1;
      puVar9 = (undefined4 *)((long)puVar9 + 0x40);
    } while (lVar5 != 0x40);
    return;
  }
  __assert_fail("nSize >= (1<<10)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x14e,"void Iso_ReadPrimes(char *)");
}

Assistant:

void Iso_ReadPrimes( char * pFileName )
{
    FILE * pFile;
    int Nums[10000];
    int i, j, Temp, nSize = 0;
    // read the numbers
    pFile = fopen( pFileName, "rb" );
    while ( fscanf( pFile, "%d", Nums + nSize++ ) == 1 );
    fclose( pFile );
    assert( nSize >= (1<<10) );
    // randomly permute
    srand( 111 );
    for ( i = 0; i < nSize; i++ )
    {
        j = rand() % nSize;
        Temp = Nums[i];
        Nums[i] = Nums[j];
        Nums[j] = Temp;
    }
    // write out
    for ( i = 0; i < 64; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 16; j++ )
            printf( "%d,", Nums[i*16+j] );
        printf( "\n" );
    }
}